

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

void RDL_deleteData(RDL_data *data)

{
  uint local_14;
  uint i;
  RDL_data *data_local;
  
  for (local_14 = 0; local_14 < data->bccGraphs->nof_bcc; local_14 = local_14 + 1) {
    RDL_deleteAPSP(data->spiPerBCC[local_14],data->bccGraphs->bcc_graphs[local_14]->V);
    RDL_deleteCycleFams(data->CFsPerBCC[local_14]);
    if (data->nofURFsPerBCC[local_14] != 0) {
      RDL_deleteURFInfo(data->urfInfoPerBCC[local_14]);
    }
  }
  free(data->spiPerBCC);
  free(data->CFsPerBCC);
  free(data->nofURFsPerBCC);
  free(data->nofRCFsPerBCC);
  free(data->urfInfoPerBCC);
  RDL_deleteBCCGraph(data->bccGraphs);
  free(data->urf_to_bcc);
  free(data->rcf_to_urf);
  RDL_deleteGraph(data->graph);
  free(data);
  return;
}

Assistant:

void RDL_deleteData(RDL_data *data)
{
  unsigned i;

  for (i = 0; i < data->bccGraphs->nof_bcc; ++i) {
    RDL_deleteAPSP(data->spiPerBCC[i], data->bccGraphs->bcc_graphs[i]->V);
    RDL_deleteCycleFams(data->CFsPerBCC[i]);
    if (data->nofURFsPerBCC[i] > 0) {
      RDL_deleteURFInfo(data->urfInfoPerBCC[i]);
    }
  }
  free(data->spiPerBCC);
  free(data->CFsPerBCC);
  free(data->nofURFsPerBCC);
  free(data->nofRCFsPerBCC);
  free(data->urfInfoPerBCC);
  RDL_deleteBCCGraph(data->bccGraphs);
  free(data->urf_to_bcc);
  free(data->rcf_to_urf);

  RDL_deleteGraph(data->graph);
  free(data);
}